

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O1

int tclpkcs11_inituserpin(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  Tcl_Obj *pTVar1;
  Tcl_Obj *pTVar2;
  tclpkcs11_handle *handle;
  int iVar3;
  long lVar4;
  CK_UTF8CHAR_PTR pCVar5;
  CK_RV CVar6;
  CK_RV errorCode;
  Tcl_Obj *pTVar7;
  char *pcVar8;
  ProcErrorProc *pPVar9;
  long slotid_long;
  int userpin_len;
  int sopin_len;
  CK_SLOT_ID local_40;
  int local_38;
  int local_34;
  
  if (cd == (ClientData)0x0) {
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "invalid clientdata";
  }
  else if (objc == 5) {
    pTVar7 = objv[2];
    pTVar1 = objv[3];
    pTVar2 = objv[4];
    lVar4 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar4 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar4 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar3 = (*tclStubsPtr->tcl_GetLongFromObj)
                        ((Tcl_Interp_conflict *)interp,pTVar7,(long *)&local_40);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = tclpkcs11_start_session(handle,local_40);
      if (iVar3 == 0) {
        pCVar5 = (CK_UTF8CHAR_PTR)(*tclStubsPtr->tcl_GetStringFromObj)(pTVar1,&local_34);
        CVar6 = (*handle->pkcs11->C_Login)(handle->session,0,pCVar5,(long)local_34);
        if (CVar6 == 0) {
          pCVar5 = (CK_UTF8CHAR_PTR)(*tclStubsPtr->tcl_GetStringFromObj)(pTVar2,&local_38);
          errorCode = (*handle->pkcs11->C_InitPIN)(handle->session,pCVar5,(long)local_38);
          CVar6 = (*handle->pkcs11->C_Logout)(handle->session);
          if (CVar6 != 0) {
            if (CVar6 != 0x32) goto LAB_001038fe;
            handle->session_active = 0;
            (*handle->pkcs11->C_CloseSession)(handle->session);
          }
          pPVar9 = tclStubsPtr->tcl_SetObjResult;
          if (errorCode == 0) {
            pTVar7 = (*tclStubsPtr->tcl_NewIntObj)(1);
            (*pPVar9)((Tcl_Interp_conflict *)interp,pTVar7);
            return 0;
          }
          if (errorCode == 0xa0) {
            pTVar7 = (*tclStubsPtr->tcl_NewIntObj)(0);
LAB_00103875:
            (*pPVar9)((Tcl_Interp_conflict *)interp,pTVar7);
            return 0;
          }
        }
        else {
          if (CVar6 == 0xa0) {
            pPVar9 = tclStubsPtr->tcl_SetObjResult;
            pTVar7 = (*tclStubsPtr->tcl_NewIntObj)(0);
            goto LAB_00103875;
          }
LAB_001038fe:
          pPVar9 = tclStubsPtr->tcl_SetObjResult;
          errorCode = CVar6;
        }
      }
      else {
        pPVar9 = tclStubsPtr->tcl_SetObjResult;
        errorCode = (long)iVar3;
      }
      pTVar7 = tclpkcs11_pkcs11_error(errorCode);
      goto LAB_001037fc;
    }
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "invalid handle";
  }
  else {
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "wrong # args: should be \"pki::pkcs11::inituserpin handle slot sopin userpin\"";
  }
  pTVar7 = (*tclStubsPtr->tcl_NewStringObj)(pcVar8,-1);
LAB_001037fc:
  (*pPVar9)((Tcl_Interp_conflict *)interp,pTVar7);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_inituserpin(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid, *tcl_sopin, *tcl_userpin;
  long slotid_long;
  char *sopin;
  int sopin_len;
  char *userpin;
  int userpin_len;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;
  CK_RV chk1_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 5) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::inituserpin handle slot sopin userpin\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  tcl_sopin = objv[3];
  tcl_userpin = objv[4];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
    return(TCL_ERROR);
  }

  sopin = Tcl_GetStringFromObj(tcl_sopin, &sopin_len);
  chk_rv = handle->pkcs11->C_Login(handle->session, CKU_SO, (CK_UTF8CHAR_PTR) sopin, sopin_len);
  if (chk_rv != CKR_OK) {
      if (chk_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
      return(TCL_ERROR);
  }
  userpin = Tcl_GetStringFromObj(tcl_userpin, &userpin_len);
  chk1_rv = handle->pkcs11->C_InitPIN(handle->session, (CK_UTF8CHAR_PTR) userpin, userpin_len);
  chk_rv = handle->pkcs11->C_Logout(handle->session);
  if (chk_rv != CKR_OK) {
    if (chk_rv == CKR_DEVICE_REMOVED) {
      handle->session_active = 0;

      handle->pkcs11->C_CloseSession(handle->session);
    } else {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      return(TCL_ERROR);
    }
  }
  if (chk1_rv != CKR_OK) {
      if (chk1_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk1_rv));
      return(TCL_ERROR);
  }

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));
  return(TCL_OK);
}